

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_FLIPRGOFF(TT_ExecContext exc,FT_Long *args)

{
  FT_Long FVar1;
  FT_Byte *pFVar2;
  ushort local_1a;
  FT_UShort L;
  FT_UShort K;
  FT_UShort I;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if ((((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
       (exc->backward_compatibility == '\0')) || (exc->iupx_called == '\0')) ||
     (exc->iupy_called == '\0')) {
    FVar1 = args[1];
    local_1a = (ushort)*args;
    if (((ushort)FVar1 < (exc->pts).n_points) && (local_1a < (exc->pts).n_points)) {
      for (; local_1a <= (ushort)FVar1; local_1a = local_1a + 1) {
        pFVar2 = (exc->pts).tags;
        pFVar2[local_1a] = pFVar2[local_1a] & 0xfe;
      }
    }
    else if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
  }
  return;
}

Assistant:

static void
  Ins_FLIPRGOFF( TT_ExecContext  exc,
                 FT_Long*        args )
  {
    FT_UShort  I, K, L;


#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    /* See `ttinterp.h' for details on backward compatibility mode. */
    if ( SUBPIXEL_HINTING_MINIMAL    &&
         exc->backward_compatibility &&
         exc->iupx_called            &&
         exc->iupy_called            )
      return;
#endif

    K = (FT_UShort)args[1];
    L = (FT_UShort)args[0];

    if ( BOUNDS( K, exc->pts.n_points ) ||
         BOUNDS( L, exc->pts.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    for ( I = L; I <= K; I++ )
      exc->pts.tags[I] &= ~FT_CURVE_TAG_ON;
  }